

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

ConstIterator __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::find(ChannelGroupManifest *this,uint64_t idValue)

{
  map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_ffffffffffffffd8;
  const_iterator local_20 [3];
  const_iterator local_8;
  
  local_20[0] = std::
                map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::find(in_stack_ffffffffffffffd8,(key_type *)0x1e6e84);
  ConstIterator::ConstIterator((ConstIterator *)&local_8,local_20);
  return (ConstIterator)(const_iterator)local_8._M_node;
}

Assistant:

IDManifest::ChannelGroupManifest::ConstIterator
IDManifest::ChannelGroupManifest::find (uint64_t idValue) const
{
    return IDManifest::ChannelGroupManifest::ConstIterator (
        _table.find (idValue));
}